

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O2

QMatrix4x4 *
QOpenGLTextureBlitter::targetTransform
          (QMatrix4x4 *__return_storage_ptr__,QRectF *target,QRect *viewport)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  float *pfVar10;
  QMatrix4x4 *pQVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  iVar4 = (viewport->x1).m_i;
  uVar5 = viewport->x1;
  uVar6 = viewport->y1;
  auVar14._0_8_ = target->xp - (double)(int)uVar5;
  auVar14._8_8_ = -(target->yp - (double)(int)uVar6);
  iVar7 = (viewport->x1).m_i;
  iVar8 = (viewport->y1).m_i;
  pfVar10 = (float *)&DAT_0017d520;
  pQVar11 = __return_storage_ptr__;
  for (lVar9 = 0x11; lVar9 != 0; lVar9 = lVar9 + -1) {
    pQVar11->m[0][0] = *pfVar10;
    pfVar10 = pfVar10 + 1;
    pQVar11 = (QMatrix4x4 *)(pQVar11->m[0] + 1);
  }
  uVar1 = viewport->x2;
  uVar2 = viewport->y2;
  auVar12._0_8_ = (double)((uVar1 + 1) - iVar7);
  auVar12._8_8_ = (double)((uVar2 + 1) - iVar8);
  auVar3._0_8_ = target->w;
  auVar3._8_8_ = target->h;
  auVar15 = divpd(auVar14,auVar12);
  auVar13._0_8_ = (double)((uVar1 + 1) - iVar4);
  auVar13._8_8_ = auVar12._8_8_;
  auVar14 = divpd(auVar3,auVar13);
  QMatrix4x4::QMatrix4x4(__return_storage_ptr__);
  *(ulong *)__return_storage_ptr__->m[3] =
       CONCAT44((float)(auVar15._8_8_ + auVar15._8_8_ + (1.0 - auVar14._8_8_)),
                (float)(auVar15._0_8_ + auVar15._0_8_ + auVar14._0_8_ + -1.0));
  __return_storage_ptr__->m[0][0] = (float)auVar14._0_8_;
  (__return_storage_ptr__->flagBits).super_QFlagsStorageHelper<QMatrix4x4::Flag,_4>.
  super_QFlagsStorage<QMatrix4x4::Flag>.i = 0x1f;
  __return_storage_ptr__->m[1][1] = (float)auVar14._8_8_;
  return __return_storage_ptr__;
}

Assistant:

QMatrix4x4 QOpenGLTextureBlitter::targetTransform(const QRectF &target,
                                                  const QRect &viewport)
{
    qreal x_scale = target.width() / viewport.width();
    qreal y_scale = target.height() / viewport.height();

    const QPointF relative_to_viewport = target.topLeft() - viewport.topLeft();
    qreal x_translate = x_scale - 1 + ((relative_to_viewport.x() / viewport.width()) * 2);
    qreal y_translate = -y_scale + 1 - ((relative_to_viewport.y() / viewport.height()) * 2);

    QMatrix4x4 matrix;
    matrix(0,3) = x_translate;
    matrix(1,3) = y_translate;

    matrix(0,0) = x_scale;
    matrix(1,1) = y_scale;

    return matrix;
}